

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optimize.cc
# Opt level: O2

void __thiscall kratos::InsertSyncReset::InsertSyncReset(InsertSyncReset *this,Generator *gen)

{
  string *psVar1;
  string *delimiter;
  element_type *peVar2;
  __type_conflict2 _Var3;
  bool bVar4;
  string *__rhs;
  pointer pbVar5;
  string *psVar6;
  undefined1 local_e8 [8];
  value_type first_token;
  value_type var_name;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  token_values;
  undefined1 local_88 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  tokens;
  undefined1 local_68 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  token_values_1;
  allocator<char> local_31;
  
  (this->super_IRVisitor).level = 0;
  (this->super_IRVisitor).visited_._M_h._M_buckets =
       &(this->super_IRVisitor).visited_._M_h._M_single_bucket;
  (this->super_IRVisitor).visited_._M_h._M_bucket_count = 1;
  (this->super_IRVisitor).visited_._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->super_IRVisitor).visited_._M_h._M_element_count = 0;
  (this->super_IRVisitor).visited_._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->super_IRVisitor).visited_._M_h._M_rehash_policy._M_next_resize = 0;
  (this->super_IRVisitor).visited_._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->super_IRVisitor)._vptr_IRVisitor = (_func_int **)&PTR_visit_root_002aa4d8;
  this->run_pass_ = false;
  this->over_clk_en_ = false;
  (this->reset_name_)._M_dataplus._M_p = (pointer)&(this->reset_name_).field_2;
  (this->reset_name_)._M_string_length = 0;
  psVar1 = &this->reset_name_;
  (this->reset_name_).field_2._M_local_buf[0] = '\0';
  __rhs = &this->sync_reset_name;
  token_values_1.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)this;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)__rhs,"sync-reset",(allocator<char> *)local_e8);
  pbVar5 = (pointer)(gen->super_IRNode).attributes_.
                    super__Vector_base<std::shared_ptr<kratos::Attribute>,_std::allocator<std::shared_ptr<kratos::Attribute>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
  tokens.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (pointer)(gen->super_IRNode).attributes_.
                super__Vector_base<std::shared_ptr<kratos::Attribute>,_std::allocator<std::shared_ptr<kratos::Attribute>_>_>
                ._M_impl.super__Vector_impl_data._M_finish;
  delimiter = (string *)(&first_token.field_2._M_allocated_capacity + 1);
  do {
    if (pbVar5 == tokens.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      return;
    }
    peVar2 = ((__shared_ptr<kratos::Attribute,_(__gnu_cxx::_Lock_policy)2> *)&pbVar5->_M_dataplus)->
             _M_ptr;
    if ((this->sync_reset_name)._M_string_length < (peVar2->value_str)._M_string_length) {
      psVar6 = &peVar2->value_str;
      std::__cxx11::string::substr((ulong)local_e8,(ulong)psVar6);
      _Var3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_e8,__rhs);
      std::__cxx11::string::~string((string *)local_e8);
      this = (InsertSyncReset *)
             token_values_1.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
      if (_Var3) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)local_e8,";",(allocator<char> *)delimiter);
        string::get_tokens((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)local_88,psVar6,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_e8);
        std::__cxx11::string::~string((string *)local_e8);
        std::__cxx11::string::string((string *)local_e8,(string *)local_88);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)delimiter,"=",(allocator<char> *)local_68);
        string::get_tokens((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)((long)&var_name.field_2 + 8),
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_e8,delimiter);
        std::__cxx11::string::~string((string *)delimiter);
        if ((long)token_values.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start - var_name.field_2._8_8_ == 0x40) {
          std::__cxx11::string::string
                    ((string *)delimiter,(string *)(var_name.field_2._8_8_ + 0x20));
          bVar4 = is_valid_variable_name(delimiter);
          if (bVar4) {
            *(undefined1 *)&((pointer)((long)this + 0x40))->_M_string_length = 1;
            std::__cxx11::string::_M_assign((string *)psVar1);
          }
          std::__cxx11::string::~string((string *)delimiter);
        }
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)((long)&var_name.field_2 + 8));
        if ((long)tokens.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start - (long)local_88 == 0x40) {
          std::__cxx11::string::string((string *)delimiter,(string *)((long)local_88 + 0x20));
          psVar6 = (string *)(var_name.field_2._M_local_buf + 8);
          std::__cxx11::string::string<std::allocator<char>>((string *)psVar6,"=",&local_31);
          string::get_tokens((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              *)local_68,delimiter,psVar6);
          std::__cxx11::string::~string((string *)psVar6);
          if ((long)token_values_1.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start - (long)local_68 == 0x40) {
            bVar4 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)local_68,"over_clk_en");
            if (bVar4) {
              bVar4 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)((long)local_68 + 0x20),"true");
              if (!bVar4) {
                bVar4 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)((long)local_68 + 0x20),"1");
                if (!bVar4) goto LAB_001e54c0;
              }
              *(undefined1 *)((long)&((pointer)((long)this + 0x40))->_M_string_length + 1) = 1;
            }
          }
LAB_001e54c0:
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)local_68);
          std::__cxx11::string::~string((string *)delimiter);
        }
        std::__cxx11::string::~string((string *)local_e8);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_88);
      }
    }
    pbVar5 = (pointer)&pbVar5->field_2;
  } while( true );
}

Assistant:

explicit InsertSyncReset(Generator* gen) {
        auto const& attributes = gen->get_attributes();
        for (auto const& attr : attributes) {
            auto const& value = attr->value_str;
            if (value.size() > sync_reset_name.size()) {
                if (value.substr(0, sync_reset_name.size()) == sync_reset_name) {
                    // get reset_name
                    auto tokens = string::get_tokens(value, ";");
                    auto first_token = tokens[0];
                    {
                        auto token_values = string::get_tokens(first_token, "=");
                        if (token_values.size() == 2) {
                            auto var_name = token_values[1];
                            if (is_valid_variable_name(var_name)) {
                                run_pass_ = true;
                                reset_name_ = var_name;
                            }
                        }
                    }
                    if (tokens.size() == 2) {
                        auto param_value = tokens[1];
                        auto token_values = string::get_tokens(param_value, "=");
                        if (token_values.size() == 2 && token_values[0] == "over_clk_en") {
                            if (token_values[1] == "true" || token_values[1] == "1") {
                                over_clk_en_ = true;
                            }
                        }
                    }
                }
            }
        }
    }